

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void jobqueue_push(jobqueue *jobqueue_p,job *job_p)

{
  job *job_p_local;
  jobqueue *jobqueue_p_local;
  
  pthread_mutex_lock((pthread_mutex_t *)jobqueue_p);
  job_p->prev = (job *)0x0;
  if (jobqueue_p->len == 0) {
    jobqueue_p->front = job_p;
    jobqueue_p->rear = job_p;
  }
  else {
    jobqueue_p->rear->prev = job_p;
    jobqueue_p->rear = job_p;
  }
  jobqueue_p->len = jobqueue_p->len + 1;
  bsem_notifyAll(jobqueue_p->has_jobs);
  pthread_mutex_unlock((pthread_mutex_t *)jobqueue_p);
  return;
}

Assistant:

static void jobqueue_push(jobqueue *jobqueue_p, job *job_p) {
    pthread_mutex_lock(&(jobqueue_p->r_w_mutex));

    job_p->prev = NULL;

    switch (jobqueue_p->len) {
        case 0:
            jobqueue_p->front = job_p;
            jobqueue_p->rear = job_p;
            break;
        default:
            jobqueue_p->rear->prev = job_p;
            jobqueue_p->rear = job_p;
    }

    jobqueue_p->len += 1;

    bsem_notifyAll(jobqueue_p->has_jobs);
    pthread_mutex_unlock(&jobqueue_p->r_w_mutex);
}